

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O0

void __thiscall dg::vr::Bucket::disconnect(Bucket *this)

{
  bool bVar1;
  const_iterator pvVar2;
  iterator val;
  pointer this_00;
  VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *in_RDI;
  iterator it;
  Type type;
  const_iterator __end2;
  const_iterator __begin2;
  array<dg::vr::Relations::Type,_12UL> *__range2;
  Bucket *in_stack_ffffffffffffffa8;
  Bucket *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffd8;
  value_type vVar3;
  const_iterator local_18;
  
  local_18 = std::array<dg::vr::Relations::Type,_12UL>::begin
                       ((array<dg::vr::Relations::Type,_12UL> *)0x1e698b);
  pvVar2 = std::array<dg::vr::Relations::Type,_12UL>::end
                     ((array<dg::vr::Relations::Type,_12UL> *)0x1e699c);
  for (; local_18 != pvVar2; local_18 = local_18 + 1) {
    vVar3 = *local_18;
    if (vVar3 == EQ) {
      std::array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL>::operator[]
                ((array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL> *)
                 in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
      VectorSet<std::reference_wrapper<dg::vr::Bucket>_>::clear
                ((VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *)0x1e69df);
    }
    std::array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL>::operator[]
              ((array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL> *)
               in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
    val = VectorSet<std::reference_wrapper<dg::vr::Bucket>_>::begin
                    ((VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *)in_stack_ffffffffffffffa8
                    );
    while( true ) {
      std::array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL>::operator[]
                ((array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL> *)
                 in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
      VectorSet<std::reference_wrapper<dg::vr::Bucket>_>::end
                ((VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *)in_stack_ffffffffffffffa8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
                          *)in_stack_ffffffffffffffb0,
                         (__normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
                          *)in_stack_ffffffffffffffa8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
      ::operator*((__normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
                   *)&stack0xffffffffffffffd0);
      std::reference_wrapper::operator_cast_to_Bucket_
                ((reference_wrapper<dg::vr::Bucket> *)0x1e6a4b);
      bVar1 = vr::operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
                  ::operator->((__normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
                                *)&stack0xffffffffffffffd0);
        in_stack_ffffffffffffffb0 = std::reference_wrapper<dg::vr::Bucket>::get(this_00);
        in_stack_ffffffffffffffb0 = (Bucket *)&in_stack_ffffffffffffffb0->relatedBuckets;
        dg::vr::Relations::inverted(vVar3);
        std::array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL>::operator[]
                  ((array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL> *)
                   in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
        VectorSet<std::reference_wrapper<dg::vr::Bucket>>::erase<dg::vr::Bucket,bool>
                  ((VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *)
                   CONCAT44(vVar3,in_stack_ffffffffffffffd8),(Bucket *)val._M_current);
      }
      std::array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL>::operator[]
                ((array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL> *)
                 in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
      val = VectorSet<std::reference_wrapper<dg::vr::Bucket>>::
            erase<__gnu_cxx::__normal_iterator<std::reference_wrapper<dg::vr::Bucket>*,std::vector<std::reference_wrapper<dg::vr::Bucket>,std::allocator<std::reference_wrapper<dg::vr::Bucket>>>>,std::random_access_iterator_tag>
                      (in_RDI,(__normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
                               *)in_stack_ffffffffffffffb0);
    }
  }
  return;
}

Assistant:

void disconnect() {
        for (Relations::Type type : Relations::all) {
            if (type == Relations::EQ) {
                assert(relatedBuckets[type].size() == 1);
                relatedBuckets[type].clear();
            }
            for (auto it = relatedBuckets[type].begin();
                 it != relatedBuckets[type].end();
                 /*incremented by erase*/) {
                if (*this != *it)
                    it->get().relatedBuckets[Relations::inverted(type)].erase(
                            *this);
                it = relatedBuckets[type].erase(it);
            }
        }
        assert(!hasAnyRelation());
    }